

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

float ncnn::reduction(float v0,float *ptr,int size0,int size1,int stride1,int op_type)

{
  int in_ESI;
  undefined8 in_RDI;
  int in_R8D;
  float in_XMM0_Da;
  float unaff_retaddr;
  int size1_00;
  int size0_00;
  undefined4 in_stack_fffffffffffffffc;
  
  size0_00 = (int)((ulong)in_RDI >> 0x20);
  size1_00 = (int)in_RDI;
  if (in_R8D == 0) {
    in_XMM0_Da = reduction<ncnn::reduction_op_add>
                           (unaff_retaddr,(float *)CONCAT44(in_stack_fffffffffffffffc,in_XMM0_Da),
                            size0_00,size1_00,in_ESI);
  }
  else if (in_R8D == 1) {
    in_XMM0_Da = reduction<ncnn::reduction_op_asum>
                           (unaff_retaddr,(float *)CONCAT44(in_stack_fffffffffffffffc,in_XMM0_Da),
                            size0_00,size1_00,in_ESI);
  }
  else if (in_R8D == 2) {
    in_XMM0_Da = reduction<ncnn::reduction_op_sumsq>
                           (unaff_retaddr,(float *)CONCAT44(in_stack_fffffffffffffffc,in_XMM0_Da),
                            size0_00,size1_00,in_ESI);
  }
  else if (in_R8D == 6) {
    in_XMM0_Da = reduction<ncnn::reduction_op_mul>
                           (unaff_retaddr,(float *)CONCAT44(in_stack_fffffffffffffffc,in_XMM0_Da),
                            size0_00,size1_00,in_ESI);
  }
  else if (in_R8D == 4) {
    in_XMM0_Da = reduction<ncnn::reduction_op_max>
                           (unaff_retaddr,(float *)CONCAT44(in_stack_fffffffffffffffc,in_XMM0_Da),
                            size0_00,size1_00,in_ESI);
  }
  else if (in_R8D == 5) {
    in_XMM0_Da = reduction<ncnn::reduction_op_min>
                           (unaff_retaddr,(float *)CONCAT44(in_stack_fffffffffffffffc,in_XMM0_Da),
                            size0_00,size1_00,in_ESI);
  }
  else if (in_R8D == 10) {
    in_XMM0_Da = reduction<ncnn::reduction_op_sumexp>
                           (unaff_retaddr,(float *)CONCAT44(in_stack_fffffffffffffffc,in_XMM0_Da),
                            size0_00,size1_00,in_ESI);
  }
  return in_XMM0_Da;
}

Assistant:

static float reduction(float v0, const float* ptr, int size0, int size1, int stride1, int op_type)
{
    if (op_type == Reduction::ReductionOp_SUM) return reduction<reduction_op_add>(v0, ptr, size0, size1, stride1);
    if (op_type == Reduction::ReductionOp_ASUM) return reduction<reduction_op_asum>(v0, ptr, size0, size1, stride1);
    if (op_type == Reduction::ReductionOp_SUMSQ) return reduction<reduction_op_sumsq>(v0, ptr, size0, size1, stride1);
    if (op_type == Reduction::ReductionOp_PROD) return reduction<reduction_op_mul>(v0, ptr, size0, size1, stride1);
    if (op_type == Reduction::ReductionOp_MAX) return reduction<reduction_op_max>(v0, ptr, size0, size1, stride1);
    if (op_type == Reduction::ReductionOp_MIN) return reduction<reduction_op_min>(v0, ptr, size0, size1, stride1);
    if (op_type == Reduction::ReductionOp_LogSumExp) return reduction<reduction_op_sumexp>(v0, ptr, size0, size1, stride1);

    // should never reach here
    return v0;
}